

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O3

char * E_phrase(entity *etmp,char *verb)

{
  char *pcVar1;
  size_t sVar2;
  
  if (etmp->emon == &youmonst) {
    pcVar1 = "You";
  }
  else {
    pcVar1 = Monnam(etmp->emon);
  }
  pcVar1 = strcpy(E_phrase::wholebuf,pcVar1);
  if (*verb != '\0') {
    sVar2 = strlen(E_phrase::wholebuf);
    (E_phrase::wholebuf + sVar2)[0] = ' ';
    (E_phrase::wholebuf + sVar2)[1] = '\0';
    if (etmp->emon != &youmonst) {
      verb = vtense((char *)0x0,verb);
    }
    pcVar1 = strcat(E_phrase::wholebuf,verb);
    return pcVar1;
  }
  return pcVar1;
}

Assistant:

static const char *E_phrase(struct entity *etmp, const char *verb)
{
	static char wholebuf[80];

	strcpy(wholebuf, is_u(etmp) ? "You" : Monnam(etmp->emon));
	if (!*verb) return wholebuf;
	strcat(wholebuf, " ");
	if (is_u(etmp))
	    strcat(wholebuf, verb);
	else
	    strcat(wholebuf, vtense(NULL, verb));
	return wholebuf;
}